

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O0

int __thiscall HistogramBasedDistribution::getMedian(HistogramBasedDistribution *this)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  long in_RDI;
  float fVar6;
  double dVar7;
  double p;
  int length;
  int end;
  int start;
  size_t i;
  double p_sum;
  int local_4c;
  ulong local_18;
  double local_10;
  
  local_10 = 0.0;
  local_18 = 0;
  while( true ) {
    sVar4 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       (in_RDI + 0x10));
    if (sVar4 <= local_18) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pvVar5 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        (in_RDI + 0x10),local_18);
    iVar1 = pvVar5->first;
    sVar4 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       (in_RDI + 0x10));
    if (local_18 + 1 < sVar4) {
      pvVar5 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RDI + 0x10),local_18 + 1);
      local_4c = pvVar5->first + -1;
    }
    else {
      local_4c = *(int *)(in_RDI + 0xc);
    }
    iVar3 = (local_4c - iVar1) + 1;
    pvVar5 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        (in_RDI + 0x10),local_18);
    dVar7 = pvVar5->second * (double)iVar3;
    if (0.5 <= local_10 + dVar7) break;
    local_10 = dVar7 + local_10;
    local_18 = local_18 + 1;
  }
  fVar6 = roundf((float)((double)iVar1 + ((double)iVar3 * (0.5 - local_10)) / dVar7));
  return (int)fVar6;
}

Assistant:

int HistogramBasedDistribution::getMedian() {
	double p_sum = 0.0;
	for (size_t i=0; i<values.size(); ++i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p >= 0.5) {
			return (int)roundf(start + ((double)length)*(0.5-p_sum)/p);
		}
		p_sum += p;
	}
	assert(false);
}